

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool ghc::filesystem::is_empty(path *p,error_code *ec)

{
  bool bVar1;
  uintmax_t uVar2;
  file_status fs;
  directory_iterator iter;
  int local_38 [2];
  directory_iterator local_30;
  directory_iterator local_20;
  
  status((filesystem *)local_38,p,ec);
  if (ec->_M_value == 0) {
    if (local_38[0] == 3) {
      directory_iterator::directory_iterator(&local_30,p,ec);
      if (ec->_M_value == 0) {
        directory_iterator::directory_iterator(&local_20);
        bVar1 = operator==(&((local_30._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path,
                           &((local_20._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_20._impl.
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      else {
        bVar1 = false;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_30._impl.
                  super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      uVar2 = file_size(p,ec);
      bVar1 = uVar2 == 0 && ec->_M_value == 0;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool is_empty(const path& p, std::error_code& ec) noexcept
{
    auto fs = status(p, ec);
    if (ec) {
        return false;
    }
    if (is_directory(fs)) {
        directory_iterator iter(p, ec);
        if (ec) {
            return false;
        }
        return iter == directory_iterator();
    }
    else {
        auto sz = file_size(p, ec);
        if (ec) {
            return false;
        }
        return sz == 0;
    }
}